

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_decoding_backend_init_file__flac
                    (void *pUserData,char *pFilePath,ma_decoding_backend_config *pConfig,
                    ma_allocation_callbacks *pAllocationCallbacks,ma_data_source **ppBackend)

{
  ma_result mVar1;
  ma_flac *pFlac;
  
  if (pAllocationCallbacks == (ma_allocation_callbacks *)0x0) {
    pFlac = (ma_flac *)malloc(0x78);
  }
  else if (pAllocationCallbacks->onMalloc == (_func_void_ptr_size_t_void_ptr *)0x0) {
    pFlac = (ma_flac *)0x0;
  }
  else {
    pFlac = (ma_flac *)(*pAllocationCallbacks->onMalloc)(0x78,pAllocationCallbacks->pUserData);
  }
  if (pFlac == (ma_flac *)0x0) {
    mVar1 = MA_OUT_OF_MEMORY;
  }
  else {
    mVar1 = ma_flac_init_file(pFilePath,pConfig,pAllocationCallbacks,pFlac);
    if (mVar1 == MA_SUCCESS) {
      *ppBackend = pFlac;
      mVar1 = MA_SUCCESS;
    }
    else if (pAllocationCallbacks == (ma_allocation_callbacks *)0x0) {
      free(pFlac);
    }
    else if (pAllocationCallbacks->onFree != (_func_void_void_ptr_void_ptr *)0x0) {
      (*pAllocationCallbacks->onFree)(pFlac,pAllocationCallbacks->pUserData);
    }
  }
  return mVar1;
}

Assistant:

static ma_result ma_decoding_backend_init_file__flac(void* pUserData, const char* pFilePath, const ma_decoding_backend_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_data_source** ppBackend)
{
    ma_result result;
    ma_flac* pFlac;

    (void)pUserData;    /* For now not using pUserData, but once we start storing the vorbis decoder state within the ma_decoder structure this will be set to the decoder so we can avoid a malloc. */

    /* For now we're just allocating the decoder backend on the heap. */
    pFlac = (ma_flac*)ma_malloc(sizeof(*pFlac), pAllocationCallbacks);
    if (pFlac == NULL) {
        return MA_OUT_OF_MEMORY;
    }

    result = ma_flac_init_file(pFilePath, pConfig, pAllocationCallbacks, pFlac);
    if (result != MA_SUCCESS) {
        ma_free(pFlac, pAllocationCallbacks);
        return result;
    }

    *ppBackend = pFlac;

    return MA_SUCCESS;
}